

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O0

shared_ptr<MyCompiler::Term> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Term>(RecursiveDescentParser *this)

{
  long lVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  SyntaxError *pSVar7;
  char *pcVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  long in_RSI;
  bool bVar11;
  shared_ptr<MyCompiler::Term> sVar12;
  allocator local_a9;
  string local_a8 [38];
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [8];
  shared_ptr<MyCompiler::Factor> p2;
  shared_ptr<MyCompiler::MulDivOp> p1;
  undefined1 local_30 [32];
  RecursiveDescentParser *this_local;
  shared_ptr<MyCompiler::Term> *pResult;
  
  local_30[0x17] = 0;
  this_local = this;
  std::make_shared<MyCompiler::Term>();
  parse<MyCompiler::Factor>((RecursiveDescentParser *)local_30);
  peVar3 = std::__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<MyCompiler::Factor>::operator=
            (&peVar3->pFactor,(shared_ptr<MyCompiler::Factor> *)local_30);
  std::shared_ptr<MyCompiler::Factor>::~shared_ptr((shared_ptr<MyCompiler::Factor> *)local_30);
  _Var10._M_pi = extraout_RDX;
  do {
    bVar11 = true;
    if (*(int *)(in_RSI + 0x30) != 5) {
      bVar11 = *(int *)(in_RSI + 0x30) == 6;
    }
    if (!bVar11) {
      sVar12.super___shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var10._M_pi;
      sVar12.super___shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<MyCompiler::Term>)
             sVar12.super___shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>;
    }
    parse<MyCompiler::MulDivOp>
              ((RecursiveDescentParser *)
               &p2.super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    parse<MyCompiler::Factor>((RecursiveDescentParser *)local_60);
    peVar3 = std::__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar4 = std::__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar3->pFactor);
    if (((peVar4->super_AbstractAstNode).caseNum == 1) &&
       (peVar4 = std::
                 __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_60), (peVar4->super_AbstractAstNode).caseNum == 1)) {
      peVar3 = std::__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      bVar11 = std::
               vector<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
               ::empty(&peVar3->vMulDivOpFactor);
      if (!bVar11) goto LAB_0010789b;
      peVar9 = std::
               __shared_ptr_access<MyCompiler::MulDivOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MyCompiler::MulDivOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&p2.super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
      bVar11 = std::operator==(&(peVar9->super_AbstractAstNode).value,"*");
      if (bVar11) {
        peVar3 = std::
                 __shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        peVar4 = std::
                 __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar3->pFactor);
        peVar5 = std::
                 __shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar4->pNumber);
        peVar3 = std::
                 __shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        peVar4 = std::
                 __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar3->pFactor);
        peVar6 = std::
                 __shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar4->pNumber);
        lVar1 = peVar6->num;
        peVar4 = std::
                 __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_60);
        peVar6 = std::
                 __shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar4->pNumber);
        Number::setNum(peVar5,lVar1 * peVar6->num);
      }
      else {
        peVar4 = std::
                 __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_60);
        peVar5 = std::
                 __shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar4->pNumber);
        if (peVar5->num == 0) {
          local_82 = 1;
          pSVar7 = (SyntaxError *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_80,"attempt to division by zero",&local_81);
          SyntaxError::SyntaxError(pSVar7,(string *)local_80);
          local_82 = 0;
          __cxa_throw(pSVar7,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
        }
        peVar3 = std::
                 __shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        peVar4 = std::
                 __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar3->pFactor);
        peVar5 = std::
                 __shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar4->pNumber);
        peVar3 = std::
                 __shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        peVar4 = std::
                 __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar3->pFactor);
        peVar6 = std::
                 __shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar4->pNumber);
        lVar1 = peVar6->num;
        peVar4 = std::
                 __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_60);
        peVar6 = std::
                 __shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar4->pNumber);
        Number::setNum(peVar5,lVar1 / peVar6->num);
      }
      peVar3 = std::__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar4 = std::
               __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar3->pFactor);
      peVar5 = std::
               __shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar4->pNumber);
      lVar1 = peVar5->num;
      iVar2 = std::numeric_limits<int>::max();
      if (iVar2 < lVar1) {
LAB_00107778:
        pSVar7 = (SyntaxError *)__cxa_allocate_exception(0x10);
        peVar9 = std::
                 __shared_ptr_access<MyCompiler::MulDivOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<MyCompiler::MulDivOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&p2.
                                  super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        bVar11 = std::operator==(&(peVar9->super_AbstractAstNode).value,"*");
        pcVar8 = "attempt to divide with overflow";
        if (bVar11) {
          pcVar8 = "attempt to multiply with overflow";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a8,pcVar8,&local_a9);
        SyntaxError::SyntaxError(pSVar7,(string *)local_a8);
        __cxa_throw(pSVar7,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
      }
      peVar3 = std::__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar4 = std::
               __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar3->pFactor);
      peVar5 = std::
               __shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar4->pNumber);
      lVar1 = peVar5->num;
      iVar2 = std::numeric_limits<int>::min();
      if (lVar1 < iVar2) goto LAB_00107778;
    }
    else {
LAB_0010789b:
      peVar3 = std::__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar9 = std::
               __shared_ptr_access<MyCompiler::MulDivOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<MyCompiler::MulDivOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&p2.super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
      peVar4 = std::
               __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_60);
      std::
      vector<std::pair<MyCompiler::MulDivOp,MyCompiler::Factor>,std::allocator<std::pair<MyCompiler::MulDivOp,MyCompiler::Factor>>>
      ::emplace_back<MyCompiler::MulDivOp&,MyCompiler::Factor&>
                ((vector<std::pair<MyCompiler::MulDivOp,MyCompiler::Factor>,std::allocator<std::pair<MyCompiler::MulDivOp,MyCompiler::Factor>>>
                  *)&peVar3->vMulDivOpFactor,peVar9,peVar4);
    }
    std::shared_ptr<MyCompiler::Factor>::~shared_ptr((shared_ptr<MyCompiler::Factor> *)local_60);
    std::shared_ptr<MyCompiler::MulDivOp>::~shared_ptr
              ((shared_ptr<MyCompiler::MulDivOp> *)
               &p2.super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    _Var10._M_pi = extraout_RDX_00;
  } while( true );
}

Assistant:

std::shared_ptr<MyCompiler::Term> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Term>();

    pResult->pFactor = parse<Factor>();
    while (sym == SymbolType::TIMES || sym == SymbolType::SLASH)
    {
        auto p1 = parse<MulDivOp>();
        auto p2 = parse<Factor>();
        if (pResult->pFactor->caseNum == 1 && p2->caseNum == 1 && pResult->vMulDivOpFactor.empty())
        {
            if (p1->value == "*")
                pResult->pFactor->pNumber->setNum(pResult->pFactor->pNumber->num * p2->pNumber->num);
            else if (p2->pNumber->num != 0)
                pResult->pFactor->pNumber->setNum(pResult->pFactor->pNumber->num / p2->pNumber->num);
            else
                throw SyntaxError("attempt to division by zero");
            if (pResult->pFactor->pNumber->num > std::numeric_limits<int32_t>::max()
                || pResult->pFactor->pNumber->num < std::numeric_limits<int32_t>::min())
                throw SyntaxError(
                        p1->value == "*" ? "attempt to multiply with overflow" : "attempt to divide with overflow");
        }
        else
            pResult->vMulDivOpFactor.emplace_back(*p1, *p2);
    }

    return pResult;
}